

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_thread_pool.h
# Opt level: O0

bool __thiscall simple_thread_pool::TaskHandle::execute(TaskHandle *this,TaskResult *ret)

{
  bool bVar1;
  TaskResult *in_RDI;
  atomic<simple_thread_pool::TaskStatus> *unaff_retaddr;
  TaskStatus desired;
  TaskStatus exp;
  undefined4 uVar2;
  undefined4 uVar3;
  TaskResult *pTVar4;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  uVar3 = 0;
  uVar2 = 1;
  pTVar4 = in_RDI;
  bVar1 = std::atomic<simple_thread_pool::TaskStatus>::compare_exchange_strong
                    (unaff_retaddr,
                     (TaskStatus *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                     (TaskStatus)((ulong)in_RDI >> 0x20),(memory_order)in_RDI);
  if (bVar1) {
    std::function<void_(const_simple_thread_pool::TaskResult_&)>::operator()
              ((function<void_(const_simple_thread_pool::TaskResult_&)> *)CONCAT44(uVar3,uVar2),
               in_RDI);
    if (in_RDI->val == OK) {
      std::atomic<simple_thread_pool::TaskStatus>::operator=
                ((atomic<simple_thread_pool::TaskStatus> *)CONCAT44(uVar3,uVar2),
                 (TaskStatus)((ulong)in_RDI >> 0x20));
    }
    else {
      std::atomic<simple_thread_pool::TaskStatus>::compare_exchange_strong
                (unaff_retaddr,
                 (TaskStatus *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                 (TaskStatus)((ulong)pTVar4 >> 0x20),(memory_order)pTVar4);
    }
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool execute(const TaskResult& ret) {
        TaskStatus exp = WAITING;
        TaskStatus desired = RUNNING;
        if (status.compare_exchange_strong(exp, desired)) {
            handler(ret);
            if (type == ONE_TIME) {
                status = DONE;
            } else {
                exp = RUNNING;
                desired = WAITING;
                status.compare_exchange_strong(exp, desired);
            }
            return true;
        }
        return false;
    }